

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createInstanceWithUnsupportedExtensionsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Functions *this;
  PlatformInterface *platformInterface;
  TestLog *pTVar1;
  int iVar2;
  MessageBuilder *this_00;
  TestError *this_01;
  long lVar3;
  TestStatus *pTVar4;
  allocator<char> local_259;
  TestStatus *local_258;
  VkInstance instance;
  VkInstanceCreateInfo instanceCreateInfo;
  char *enabledExtensions [2];
  InstanceDriver instanceIface;
  VkApplicationInfo appInfo;
  
  platformInterface = context->m_platformInterface;
  pTVar1 = context->m_testCtx->m_log;
  instanceCreateInfo.ppEnabledExtensionNames = enabledExtensions;
  enabledExtensions[0] = "VK_UNSUPPORTED_EXTENSION";
  enabledExtensions[1] = "THIS_IS_NOT_AN_EXTENSION";
  instanceCreateInfo.pApplicationInfo = &appInfo;
  appInfo.pEngineName = "engineName";
  appInfo.engineVersion = 0;
  appInfo.apiVersion = 0x400000;
  appInfo.pApplicationName = "appName";
  appInfo.applicationVersion = 0;
  appInfo._28_4_ = 0;
  instanceCreateInfo.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  instanceCreateInfo.pNext = (void *)0x0;
  instanceCreateInfo.flags = 0;
  instanceCreateInfo.enabledLayerCount = 0;
  appInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  appInfo._4_4_ = 0;
  appInfo.pNext = (void *)0x0;
  instanceCreateInfo.ppEnabledLayerNames = (char **)0x0;
  instanceCreateInfo.enabledExtensionCount = 2;
  this = &instanceIface.m_vk;
  local_258 = __return_storage_ptr__;
  instanceIface.super_InstanceInterface._vptr_InstanceInterface = (_func_int **)pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,"Enabled extensions are: ");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&instanceIface,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 8) {
    instanceIface.super_InstanceInterface._vptr_InstanceInterface = (_func_int **)pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&instanceIface.m_vk);
    this_00 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&instanceIface,(char **)((long)enabledExtensions + lVar3)
                        );
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&instanceIface.m_vk);
  }
  instance = (VkInstance)0x0;
  iVar2 = (**platformInterface->_vptr_PlatformInterface)
                    (platformInterface,&instanceCreateInfo,0,&instance);
  if (instance == (VkInstance)0x0) {
    if (iVar2 == -7) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&instanceIface,
                 "Pass, creating instance with unsupported extension was rejected.",&local_259);
      pTVar4 = local_258;
      tcu::TestStatus::pass(local_258,(string *)&instanceIface);
      goto LAB_004608e4;
    }
  }
  else {
    ::vk::InstanceDriver::InstanceDriver(&instanceIface,platformInterface,instance);
    ::vk::InstanceDriver::destroyInstance(&instanceIface,instance,(VkAllocationCallbacks *)0x0);
    ::vk::InstanceDriver::~InstanceDriver(&instanceIface);
    if (iVar2 == -7) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,(char *)0x0,"!gotInstance",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                 ,0x15b);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&instanceIface,
             "Fail, creating instance with unsupported extensions succeeded.",&local_259);
  pTVar4 = local_258;
  tcu::TestStatus::fail(local_258,(string *)&instanceIface);
LAB_004608e4:
  std::__cxx11::string::~string((string *)&instanceIface);
  return pTVar4;
}

Assistant:

tcu::TestStatus createInstanceWithUnsupportedExtensionsTest (Context& context)
{
	tcu::TestLog&						log						= context.getTestContext().getLog();
	const PlatformInterface&			platformInterface		= context.getPlatformInterface();
	const char*							enabledExtensions[]		= {"VK_UNSUPPORTED_EXTENSION", "THIS_IS_NOT_AN_EXTENSION"};
	const VkApplicationInfo				appInfo					=
	{
		VK_STRUCTURE_TYPE_APPLICATION_INFO,						// VkStructureType				sType;
		DE_NULL,												// const void*					pNext;
		"appName",												// const char*					pAppName;
		0u,														// deUint32						appVersion;
		"engineName",											// const char*					pEngineName;
		0u,														// deUint32						engineVersion;
		VK_API_VERSION,											// deUint32						apiVersion;
	};
	const VkInstanceCreateInfo			instanceCreateInfo		=
	{
		VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,					// VkStructureType				sType;
		DE_NULL,												// const void*					pNext;
		(VkInstanceCreateFlags)0u,								// VkInstanceCreateFlags		flags;
		&appInfo,												// const VkApplicationInfo*		pAppInfo;
		0u,														// deUint32						layerCount;
		DE_NULL,												// const char*const*			ppEnabledLayernames;
		DE_LENGTH_OF_ARRAY(enabledExtensions),					// deUint32						extensionCount;
		enabledExtensions,										// const char*const*			ppEnabledExtensionNames;
	};

	log << TestLog::Message << "Enabled extensions are: " << TestLog::EndMessage;

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(enabledExtensions); ndx++)
		log << TestLog::Message << enabledExtensions[ndx] <<  TestLog::EndMessage;

	{
		VkInstance		instance	= (VkInstance)0;
		const VkResult	result		= platformInterface.createInstance(&instanceCreateInfo, DE_NULL/*pAllocator*/, &instance);
		const bool		gotInstance	= !!instance;

		if (instance)
		{
			const InstanceDriver	instanceIface	(platformInterface, instance);
			instanceIface.destroyInstance(instance, DE_NULL/*pAllocator*/);
		}

		if (result == VK_ERROR_EXTENSION_NOT_PRESENT)
		{
			TCU_CHECK(!gotInstance);
			return tcu::TestStatus::pass("Pass, creating instance with unsupported extension was rejected.");
		}
		else
			return tcu::TestStatus::fail("Fail, creating instance with unsupported extensions succeeded.");
	}
}